

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O2

Matrix<unsigned_char> *
ZXing::ToMatrix<unsigned_char>
          (Matrix<unsigned_char> *__return_storage_ptr__,BitMatrix *in,uchar black,uchar white)

{
  bool bVar1;
  uchar uVar2;
  long lVar3;
  int y;
  int y_00;
  
  Matrix<unsigned_char>::Matrix(__return_storage_ptr__,*(int *)in,*(int *)(in + 4),'\0');
  for (y_00 = 0; y_00 < *(int *)(in + 4); y_00 = y_00 + 1) {
    for (lVar3 = 0; (int)lVar3 < *(int *)in; lVar3 = lVar3 + 1) {
      bVar1 = BitMatrix::get(in,(int)lVar3,y_00);
      uVar2 = white;
      if (bVar1) {
        uVar2 = black;
      }
      (__return_storage_ptr__->_data).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3 + (long)__return_storage_ptr__->_width * (long)y_00] =
           uVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> ToMatrix(const BitMatrix& in, T black = 0, T white = ~0)
{
	Matrix<T> res(in.width(), in.height());
	for (int y = 0; y < in.height(); ++y)
		for (int x = 0; x < in.width(); ++x)
			res.set(x, y, in.get(x, y) ? black : white);
	return res;
}